

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O3

void test_custom_storage(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type *psVar2;
  size_type *psVar3;
  size_type *psVar4;
  char cVar5;
  int iVar6;
  opt_str os_;
  undefined1 local_90 [8];
  size_type sStack_88;
  char local_80;
  opt_str os0;
  opt_str osA;
  
  psVar4 = &os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
            _M_string_length;
  os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
  _M_string_length = 0x676e696874796e61;
  os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second._M_dataplus.
  _M_p = (pointer)0x8;
  os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
  _M_local_buf[0] = '\0';
  pbVar1 = &osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second;
  os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_._0_8_ = psVar4;
  os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2._8_8_ =
       pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             ((long)&os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                     second.field_2 + 8),"");
  psVar2 = &os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
            _M_string_length;
  local_80 = '\x01';
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
      _8_8_ == pbVar1) {
    os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
    _M_allocated_capacity._0_4_ =
         (undefined4)
         osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
         _M_string_length;
    os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
    _M_allocated_capacity._4_4_ =
         osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
         _M_string_length._4_4_;
    os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_._0_8_ = psVar2;
  }
  else {
    os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_._0_8_ =
         os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
         _8_8_;
  }
  os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second._M_dataplus.
  _M_p = (pointer)osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_._0_8_;
  os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2._8_8_ =
       local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             ((long)&os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                     second.field_2 + 8),"A","");
  psVar3 = &osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
            _M_string_length;
  os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
  _M_local_buf[8] = 1;
  if ((undefined1 *)
      os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
      _8_8_ == local_90) {
    osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
    _M_allocated_capacity = sStack_88;
    osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_._0_8_ = psVar3;
  }
  else {
    osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_._0_8_ =
         os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
         _8_8_;
  }
  if (local_80 == '\0') {
    __assert_fail("os0.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x57,"void test_custom_storage()");
  }
  iVar6 = std::__cxx11::string::compare((char *)&os0);
  if (iVar6 != 0) {
    __assert_fail("os0.value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x58,"void test_custom_storage()");
  }
  if (os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.field_2.
      _M_local_buf[8] == '\0') {
    __assert_fail("osA.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x5a,"void test_custom_storage()");
  }
  iVar6 = std::__cxx11::string::compare((char *)&osA);
  cVar5 = local_80;
  if (iVar6 != 0) {
    __assert_fail("osA.value() == \"A\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x5b,"void test_custom_storage()");
  }
  local_80 = '\0';
  std::__cxx11::string::swap((string *)&os_);
  if (cVar5 == '\0') {
    __assert_fail("os_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x5f,"void test_custom_storage()");
  }
  iVar6 = std::__cxx11::string::compare((char *)&os_);
  if (iVar6 != 0) {
    __assert_fail("os_.value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x60,"void test_custom_storage()");
  }
  if (local_80 != '\0') {
    __assert_fail("!os0.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x61,"void test_custom_storage()");
  }
  if ((size_type *)osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_._0_8_
      != psVar3) {
    operator_delete((void *)osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.
                            value_._0_8_);
  }
  if ((size_type *)os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_._0_8_
      != psVar2) {
    operator_delete((void *)os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.
                            value_._0_8_);
  }
  if ((size_type *)os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_._0_8_
      != psVar4) {
    operator_delete((void *)os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.
                            value_._0_8_);
  }
  return;
}

Assistant:

void test_custom_storage()
{
  typedef compact_optional<string_in_pair_empty_val> opt_str;
  opt_str os_, os0(std::string("\0")), osA(std::string("A"));
  
  assert (!os_.has_value());
  
  assert (os0.has_value());
  assert (os0.value() == "");
  
  assert (osA.has_value());
  assert (osA.value() == "A");

  swap (os_, os0);
    
  assert (os_.has_value());
  assert (os_.value() == "");
  assert (!os0.has_value());
}